

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O2

bool iutest::TestSuite::IsSuccessfulTest(TestInfo *p)

{
  bool bVar1;
  
  if (p[0x99] != (TestInfo)0x1) {
    return false;
  }
  bVar1 = TestInfo::is_skipped(p);
  if (bVar1) {
    return false;
  }
  bVar1 = TestResult::Passed((TestResult *)(p + 0x40));
  return bVar1;
}

Assistant:

static bool IsSkipTest(const TestInfo* p) { return !p->is_ran() || p->is_skipped(); }